

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenu::wheelEvent(QMenu *this,QWheelEvent *e)

{
  QMenuPrivate *this_00;
  QWidget *in_RSI;
  QWheelEvent *in_RDI;
  long in_FS_OFFSET;
  bool in_stack_0000000a;
  bool in_stack_0000000b;
  ScrollDirection in_stack_0000000c;
  QMenuPrivate *in_stack_00000010;
  QMenuPrivate *d;
  byte local_51;
  QPoint local_20;
  QRect local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QMenu *)0x64ab0f);
  local_51 = 0;
  if (this_00->scroll != (QMenuScroller *)0x0) {
    local_18 = QWidget::rect(in_RSI);
    QSinglePointEvent::position((QSinglePointEvent *)0x64ab47);
    local_20 = QPointF::toPoint((QPointF *)this_00);
    local_51 = QRect::contains((QPoint *)&local_18,SUB81(&local_20,0));
  }
  if ((local_51 & 1) != 0) {
    QWheelEvent::angleDelta(in_RDI);
    QPoint::y((QPoint *)0x64aba3);
    QMenuPrivate::scrollMenu
              (in_stack_00000010,in_stack_0000000c,in_stack_0000000b,in_stack_0000000a);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenu::wheelEvent(QWheelEvent *e)
{
    Q_D(QMenu);
    if (d->scroll && rect().contains(e->position().toPoint()))
        d->scrollMenu(e->angleDelta().y() > 0 ?
                      QMenuPrivate::QMenuScroller::ScrollUp : QMenuPrivate::QMenuScroller::ScrollDown);
}